

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppleII.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_759566::StretchedAYPair::apply_samples<(Outputs::Speaker::Action)1>
          (StretchedAYPair *this,size_t number_of_samples,StereoSample *target)

{
  int iVar1;
  undefined1 local_2c [4];
  StereoSample *local_28;
  size_t c;
  StereoSample *target_local;
  size_t number_of_samples_local;
  StretchedAYPair *this_local;
  
  c = (size_t)target;
  target_local = (StereoSample *)number_of_samples;
  number_of_samples_local = (size_t)this;
  for (local_28 = (StereoSample *)0x0; local_28 < target_local;
      local_28 = (StereoSample *)((long)&local_28->left + 1)) {
    this->subdivider_ = this->subdivider_ + 1;
    if (this->subdivider_ == 0x1c) {
      this->phase_ = this->phase_ + 1;
      iVar1 = -1;
      if ((this->phase_ & 0xfU) != 0) {
        iVar1 = 0;
      }
      this->subdivider_ = iVar1;
      if (this->phase_ == 0x41) {
        this->phase_ = 0;
      }
      Apple::II::AYPair::advance(&this->super_AYPair);
    }
    Apple::II::AYPair::level((AYPair *)local_2c);
    *(undefined1 (*) [4])(c + (long)local_28 * 4) = local_2c;
  }
  return;
}

Assistant:

void apply_samples(std::size_t number_of_samples, Outputs::Speaker::StereoSample *target) {

			// (1) take 64 windows of 7 input cycles followed by one window of 8 input cycles;
			// (2) after each four windows, advance the underlying AY.
			//
			// i.e. advance after:
			//
			//	* 28 cycles, {16 times, then 15 times, then 15 times, then 15 times};
			//	* 29 cycles, once.
			//
			// so:
			//	16, 1;	15, 1;	15, 1;	15, 1
			//
			// i.e. add an extra one on the 17th, 33rd, 49th and 65th ticks in a 65-tick loop.
			for(std::size_t c = 0; c < number_of_samples; c++) {
				++subdivider_;
				if(subdivider_ == 28) {
					++phase_;
					subdivider_ = (phase_ & 15) ? 0 : -1;
					if(phase_ == 65) phase_ = 0;

					advance();
				}

				target[c] = level();
			}
		}